

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          string_view_type *key)

{
  json_storage_kind jVar1;
  undefined8 uVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string_view_type *in_RDI;
  sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *unaff_retaddr;
  char *in_stack_00000008;
  not_an_object *in_stack_00000010;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe8;
  
  jVar1 = storage_kind((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI);
  if (jVar1 != empty_object) {
    if (jVar1 == json_reference) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
                (in_stack_ffffffffffffffd0);
      json_reference_storage::value((json_reference_storage *)0x545b25);
      erase((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RSI,
            (string_view_type *)CONCAT17(jVar1,in_stack_ffffffffffffffe8));
    }
    else {
      if (jVar1 != object) {
        uVar2 = __cxa_allocate_exception(0x58);
        std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
        std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
        not_an_object::not_an_object<char>
                  (in_stack_00000010,in_stack_00000008,(size_t)unaff_retaddr);
        __cxa_throw(uVar2,&not_an_object::typeinfo,not_an_object::~not_an_object);
      }
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                (in_stack_ffffffffffffffd0);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
      value_abi_cxx11_((object_storage *)in_stack_00000010);
      sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
      ::erase(unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

void erase(const string_view_type& key)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    break;
                case json_storage_kind::object:
                    cast<object_storage>().value().erase(key);
                    break;
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().erase(key);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }